

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  int *piVar4;
  int local_44;
  int iFanin;
  int iObj;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *vNodes;
  Vec_Int_t *vNodesInit_local;
  Wlc_Ntk_t *p_local;
  
  pNew = (Wlc_Ntk_t *)vNodesInit;
  if (vNodesInit == (Vec_Int_t *)0x0) {
    pNew = (Wlc_Ntk_t *)Wlc_NtkCollectMultipliers(p);
  }
  if (pNew == (Wlc_Ntk_t *)0x0) {
    p_local = (Wlc_Ntk_t *)0x0;
  }
  else {
    for (iObj = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pNew), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,iObj);
      pWVar3 = Wlc_NtkObj(p,iVar1);
      *(ushort *)pWVar3 = *(ushort *)pWVar3 & 0xff7f | 0x80;
    }
    Wlc_NtkCleanCopy(p);
    for (iObj = 1; iVar1 = Wlc_NtkObjNumMax(p), iObj < iVar1; iObj = iObj + 1) {
      pWVar3 = Wlc_NtkObj(p,iObj);
      iVar1 = Vec_IntSize(&p->vCopies);
      if (iObj == iVar1) break;
      if ((*(ushort *)pWVar3 >> 7 & 1) == 0) {
        for (iFanin = 0; iVar1 = Wlc_ObjFaninNum(pWVar3), iFanin < iVar1; iFanin = iFanin + 1) {
          iVar1 = Wlc_ObjFaninId(pWVar3,iFanin);
          iVar1 = Wlc_ObjCopy(p,iVar1);
          piVar4 = Wlc_ObjFanins(pWVar3);
          piVar4[iFanin] = iVar1;
        }
        local_44 = iObj;
      }
      else {
        *(ushort *)pWVar3 = *(ushort *)pWVar3 & 0xff7f;
        iVar1 = Wlc_ObjIsSigned(pWVar3);
        iVar2 = Wlc_ObjRange(pWVar3);
        local_44 = Wlc_ObjAlloc(p,1,iVar1,iVar2 + -1,0);
      }
      Wlc_ObjSetCopy(p,iObj,local_44);
    }
    if (pNew != (Wlc_Ntk_t *)vNodesInit) {
      Vec_IntFree((Vec_Int_t *)pNew);
    }
    p_local = Wlc_NtkDupDfs(p,0,1);
  }
  return p_local;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}